

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O2

void ay8910_reset(void *chip)

{
  UINT8 r;
  
  *(undefined2 *)((long)chip + 0xe) = 0;
  *(undefined4 *)((long)chip + 0x48) = 1;
  *(undefined8 *)((long)chip + 0x34) = 0;
  *(undefined8 *)((long)chip + 0x24) = 0;
  *(undefined8 *)((long)chip + 0x2c) = 0;
  *(undefined1 *)((long)chip + 0x20) = 0xff;
  for (r = '\0'; r != '\x0e'; r = r + '\x01') {
    ay8910_write_reg((ay8910_context *)chip,r,'\0');
  }
  if ((*(byte *)((long)chip + 0x2cc) & 0x20) != 0) {
    *(undefined1 *)((long)chip + 0x2ce) = 1;
  }
  return;
}

Assistant:

void ay8910_reset(void *chip)
{
	ay8910_context *psg = (ay8910_context *)chip;
	UINT8 i;

	psg->active = 0;
	psg->register_latch = 0;
	psg->rng = 1;
	psg->output[0] = 0;
	psg->output[1] = 0;
	psg->output[2] = 0;
	psg->count[0] = 0;
	psg->count[1] = 0;
	psg->count[2] = 0;
	psg->count_noise = 0;
	psg->count_env = 0;
	psg->prescale_noise = 0;
	psg->last_enable = 0xFF;    /* force a write */
	for (i = 0;i < AY_PORTA;i++)
		ay8910_write_reg(psg,i,0);
	//psg->ready = 1;
#if ENABLE_REGISTER_TEST
	ay8910_write_reg(psg, AY_AFINE, 0);
	ay8910_write_reg(psg, AY_ACOARSE, 1);
	ay8910_write_reg(psg, AY_BFINE, 0);
	ay8910_write_reg(psg, AY_BCOARSE, 2);
	ay8910_write_reg(psg, AY_CFINE, 0);
	ay8910_write_reg(psg, AY_CCOARSE, 4);
	//#define AY_NOISEPER   (6)
	ay8910_write_reg(psg, AY_ENABLE, ~7);
	ay8910_write_reg(psg, AY_AVOL, 10);
	ay8910_write_reg(psg, AY_BVOL, 10);
	ay8910_write_reg(psg, AY_CVOL, 10);
	//#define AY_EFINE  (11)
	//#define AY_ECOARSE    (12)
	//#define AY_ESHAPE (13)
#endif

	if (psg->chip_type & 0x20)
		psg->IsDisabled = 0x01;	// YM2203/2608/2610 SSG optimization
}